

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderConstExprTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderConstExprBuiltinTests::init
          (ShaderConstExprBuiltinTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  int extraout_EAX;
  TestNode *node;
  long lVar3;
  undefined **ppuVar4;
  TestParams *pTVar5;
  byte bVar6;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  TestParams cases [15];
  
  bVar6 = 0;
  cases[0].name = "radians";
  cases[0].expression = "radians(${T} (90.0))";
  cases[0]._16_8_ = &DAT_100000001;
  cases[0].maxComponents = 4;
  cases[0].outType = TYPE_FLOAT;
  cases[0].output = 1.5707964;
  cases[1].name = "degrees";
  cases[1].expression = "degrees(${T} (2.0))";
  cases[1]._16_8_ = &DAT_100000001;
  cases[1].maxComponents = 4;
  cases[1].outType = TYPE_FLOAT;
  cases[1].output = 114.59155;
  cases[2].name = "sin";
  cases[2].expression = "sin(${T} (3.0))";
  cases[2]._16_8_ = &DAT_100000001;
  cases[2].maxComponents = 4;
  cases[2].outType = TYPE_FLOAT;
  cases[2].output = 0.14112;
  cases[3].name = "cos";
  cases[3].expression = "cos(${T} (3.2))";
  cases[3]._16_8_ = &DAT_100000001;
  cases[3].maxComponents = 4;
  cases[3].outType = TYPE_FLOAT;
  cases[3].output = -0.9982948;
  cases[4].name = "tan";
  cases[4].expression = "tan(${T} (1.5))";
  cases[4]._16_8_ = &DAT_100000001;
  cases[4].maxComponents = 4;
  cases[4].outType = TYPE_FLOAT;
  cases[4].output = 14.10142;
  cases[5].name = "asin";
  cases[5].expression = "asin(${T} (0.0))";
  cases[5]._16_8_ = &DAT_100000001;
  cases[5].maxComponents = 4;
  cases[5].outType = TYPE_FLOAT;
  cases[5].output = 0.0;
  cases[6].name = "acos";
  cases[6].expression = "acos(${T} (1.0))";
  cases[6]._16_8_ = &DAT_100000001;
  cases[6].maxComponents = 4;
  cases[6].outType = TYPE_FLOAT;
  cases[6].output = 0.0;
  cases[7].name = "atan_separate";
  cases[7].expression = "atan(${T} (-1.0), ${T} (-1.0))";
  cases[7]._16_8_ = &DAT_100000001;
  cases[7].maxComponents = 4;
  cases[7].outType = TYPE_FLOAT;
  cases[7].output = -2.3561945;
  cases[8].name = "atan_combined";
  cases[8].expression = "atan(${T} (2.0))";
  cases[8]._16_8_ = &DAT_100000001;
  cases[8].maxComponents = 4;
  cases[8].outType = TYPE_FLOAT;
  cases[8].output = 1.1071488;
  cases[9].name = "sinh";
  cases[9].expression = "sinh(${T} (1.5))";
  cases[9]._16_8_ = &DAT_100000001;
  cases[9].maxComponents = 4;
  cases[9].outType = TYPE_FLOAT;
  cases[9].output = 2.1292794;
  cases[10].name = "cosh";
  cases[10].expression = "cosh(${T} (1.5))";
  cases[10]._16_8_ = &DAT_100000001;
  cases[10].maxComponents = 4;
  cases[10].outType = TYPE_FLOAT;
  cases[10].output = 2.3524096;
  cases[0xb].name = "tanh";
  cases[0xb].expression = "tanh(${T} (1.5))";
  cases[0xb]._16_8_ = &DAT_100000001;
  cases[0xb].maxComponents = 4;
  cases[0xb].outType = TYPE_FLOAT;
  tanhf(1.5);
  cases[0xb].output = 0.90514827;
  cases[0xc].name = "asinh";
  cases[0xc].expression = "asinh(${T} (2.0))";
  cases[0xc]._16_8_ = &DAT_100000001;
  cases[0xc].maxComponents = 4;
  cases[0xc].outType = TYPE_FLOAT;
  cases[0xc].output = 1.4436355;
  cases[0xd].name = "acosh";
  cases[0xd].expression = "acosh(${T} (2.0))";
  cases[0xd]._16_8_ = &DAT_100000001;
  cases[0xd].maxComponents = 4;
  cases[0xd].outType = TYPE_FLOAT;
  cases[0xd].output = 1.316958;
  cases[0xe].name = "atanh";
  cases[0xe].expression = "atanh(${T} (0.8))";
  cases[0xe]._16_8_ = &DAT_100000001;
  cases[0xe].maxComponents = 4;
  cases[0xe].outType = TYPE_FLOAT;
  cases[0xe].output = 1.0986123;
  addChildGroup(this,"angle_and_trigonometry","Angles and Trigonometry",cases,0xf);
  cases[0].name = "pow";
  cases[0].expression = "pow(${T} (1.7), ${T} (3.5))";
  cases[0]._16_8_ = &DAT_100000001;
  cases[0].maxComponents = 4;
  cases[0].outType = TYPE_FLOAT;
  cases[0].output = 6.405769;
  cases[1].name = "exp";
  cases[1].expression = "exp(${T} (4.2))";
  cases[1]._16_8_ = &DAT_100000001;
  cases[1].maxComponents = 4;
  cases[1].outType = TYPE_FLOAT;
  cases[1].output = 66.68632;
  cases[2].name = "log";
  cases[2].expression = "log(${T} (42.12))";
  cases[2]._16_8_ = &DAT_100000001;
  cases[2].maxComponents = 4;
  cases[2].outType = TYPE_FLOAT;
  cases[2].output = 3.7405226;
  cases[3].name = "exp2";
  cases[3].expression = "exp2(${T} (6.7))";
  cases[3]._16_8_ = &DAT_100000001;
  cases[3].maxComponents = 4;
  cases[3].outType = TYPE_FLOAT;
  cases[3].output = 103.968285;
  cases[4].name = "log2";
  cases[4].expression = "log2(${T} (100.0))";
  cases[4]._16_8_ = &DAT_100000001;
  cases[4].maxComponents = 4;
  cases[4].outType = TYPE_FLOAT;
  cases[4].output = 6.643856;
  cases[5].name = "sqrt";
  cases[5].expression = "sqrt(${T} (10.0))";
  cases[5]._16_8_ = &DAT_100000001;
  cases[5].maxComponents = 4;
  cases[5].outType = TYPE_FLOAT;
  cases[5].output = 3.1622777;
  cases[6].name = "inversesqrt";
  cases[6].expression = "inversesqrt(${T} (10.0))";
  cases[6]._16_8_ = &DAT_100000001;
  cases[6].maxComponents = 4;
  cases[6].outType = TYPE_FLOAT;
  cases[6].output = 0.31622776;
  addChildGroup(this,"exponential","Exponential",cases,7);
  cases[0].name = "abs";
  cases[0].expression = "abs(${T} (-42.0))";
  cases[0]._16_8_ = &DAT_100000001;
  cases[0].maxComponents = 4;
  cases[0].outType = TYPE_FLOAT;
  cases[0].output = 42.0;
  cases[1].name = "abs";
  cases[1].expression = "abs(${T} (-42))";
  cases[1].inType = TYPE_INT;
  cases[1].minComponents = 1;
  cases[1].maxComponents = 4;
  cases[1].outType = TYPE_INT;
  cases[1].output = 42.0;
  cases[2].name = "sign";
  cases[2].expression = "sign(${T} (-18.0))";
  cases[2]._16_8_ = &DAT_100000001;
  cases[2].maxComponents = 4;
  cases[2].outType = TYPE_FLOAT;
  cases[2].output = -1.0;
  cases[3].name = "sign";
  cases[3].expression = "sign(${T} (-18))";
  cases[3].inType = TYPE_INT;
  cases[3].minComponents = 1;
  cases[3].maxComponents = 4;
  cases[3].outType = TYPE_INT;
  cases[3].output = -1.0;
  cases[4].name = "floor";
  cases[4].expression = "floor(${T} (37.3))";
  cases[4]._16_8_ = &DAT_100000001;
  cases[4].maxComponents = 4;
  cases[4].outType = TYPE_FLOAT;
  cases[4].output = 37.0;
  cases[5].name = "trunc";
  cases[5].expression = "trunc(${T} (-1.8))";
  cases[5]._16_8_ = &DAT_100000001;
  cases[5].maxComponents = 4;
  cases[5].outType = TYPE_FLOAT;
  cases[5].output = -1.0;
  cases[6].name = "round";
  cases[6].expression = "round(${T} (42.7))";
  cases[6]._16_8_ = &DAT_100000001;
  cases[6].maxComponents = 4;
  cases[6].outType = TYPE_FLOAT;
  cases[6].output = 42.0;
  cases[7].name = "roundEven";
  cases[7].expression = "roundEven(${T} (1.5))";
  cases[7]._16_8_ = &DAT_100000001;
  cases[7].maxComponents = 4;
  cases[7].outType = TYPE_FLOAT;
  cases[7].output = 2.0;
  cases[8].name = "ceil";
  cases[8].expression = "ceil(${T} (82.2))";
  cases[8]._16_8_ = &DAT_100000001;
  cases[8].maxComponents = 4;
  cases[8].outType = TYPE_FLOAT;
  cases[8].output = 83.0;
  cases[9].name = "fract";
  cases[9].expression = "fract(${T} (17.75))";
  cases[9]._16_8_ = &DAT_100000001;
  cases[9].maxComponents = 4;
  cases[9].outType = TYPE_FLOAT;
  cases[9].output = 0.75;
  cases[10].name = "mod";
  cases[10].expression = "mod(${T} (87.65), ${MT} (3.7))";
  cases[10]._16_8_ = &DAT_100000001;
  cases[10].maxComponents = 4;
  cases[10].outType = TYPE_FLOAT;
  cases[10].output = 2.5500004;
  cases[0xb].name = "min";
  cases[0xb].expression = "min(${T} (12.3), ${MT} (32.1))";
  cases[0xb]._16_8_ = &DAT_100000001;
  cases[0xb].maxComponents = 4;
  cases[0xb].outType = TYPE_FLOAT;
  cases[0xb].output = 12.3;
  cases[0xc].name = "min";
  cases[0xc].expression = "min(${T} (13), ${MT} (-14))";
  cases[0xc].inType = TYPE_INT;
  cases[0xc].minComponents = 1;
  cases[0xc].maxComponents = 4;
  cases[0xc].outType = TYPE_INT;
  cases[0xc].output = -14.0;
  cases[0xd].name = "min";
  cases[0xd].expression = "min(${T} (13), ${MT} (14))";
  cases[0xd].inType = TYPE_UINT;
  cases[0xd].minComponents = 1;
  cases[0xd].maxComponents = 4;
  cases[0xd].outType = TYPE_UINT;
  cases[0xd].output = 13.0;
  cases[0xe].name = "max";
  cases[0xe].expression = "max(${T} (12.3), ${MT} (32.1))";
  cases[0xe]._16_8_ = &DAT_100000001;
  cases[0xe].maxComponents = 4;
  cases[0xe].outType = TYPE_FLOAT;
  cases[0xe].output = 32.1;
  addChildGroup(this,"common","Common",cases,0x1f);
  memcpy(cases,&DAT_02181960,200);
  addChildGroup(this,"float_pack_unpack","Floating point pack & unpack",cases,5);
  cases[0].name = "length_float";
  cases[0].expression = "length(1.0)";
  cases[0]._16_8_ = &DAT_100000001;
  cases[0]._24_8_ = &DAT_100000001;
  cases[0].output = 1.0;
  cases[1].name = "length_vec2";
  cases[1].expression = "length(vec2(1.0))";
  cases[1]._16_8_ = &DAT_100000001;
  cases[1]._24_8_ = &DAT_100000001;
  cases[1].output = 1.4142135;
  cases[2].name = "length_vec3";
  cases[2].expression = "length(vec3(1.0))";
  cases[2]._16_8_ = &DAT_100000001;
  cases[2]._24_8_ = &DAT_100000001;
  cases[2].output = 1.7320508;
  cases[3].name = "length_vec4";
  cases[3].expression = "length(vec4(1.0))";
  cases[3]._16_8_ = &DAT_100000001;
  cases[3]._24_8_ = &DAT_100000001;
  cases[3].output = 2.0;
  cases[4].name = "distance_float";
  cases[4].expression = "distance(1.0, 2.0)";
  cases[4]._16_8_ = &DAT_100000001;
  cases[4]._24_8_ = &DAT_100000001;
  cases[4].output = 1.0;
  cases[5].name = "distance_vec2";
  cases[5].expression = "distance(vec2(1.0), vec2(2.0))";
  cases[5]._16_8_ = &DAT_100000001;
  cases[5]._24_8_ = &DAT_100000001;
  cases[5].output = 1.4142135;
  cases[6].name = "distance_vec3";
  cases[6].expression = "distance(vec3(1.0), vec3(2.0))";
  cases[6]._16_8_ = &DAT_100000001;
  cases[6]._24_8_ = &DAT_100000001;
  cases[6].output = 1.7320508;
  cases[7].name = "distance_vec4";
  cases[7].expression = "distance(vec4(1.0), vec4(2.0))";
  cases[7]._16_8_ = &DAT_100000001;
  cases[7]._24_8_ = &DAT_100000001;
  cases[7].output = 2.0;
  cases[8].name = "dot_float";
  cases[8].expression = "dot(1.0, 1.0)";
  cases[8]._16_8_ = &DAT_100000001;
  cases[8]._24_8_ = &DAT_100000001;
  cases[8].output = 1.0;
  cases[9].name = "dot_vec2";
  cases[9].expression = "dot(vec2(1.0), vec2(1.0))";
  cases[9]._16_8_ = &DAT_100000001;
  cases[9]._24_8_ = &DAT_100000001;
  cases[9].output = 2.0;
  cases[10].name = "dot_vec3";
  cases[10].expression = "dot(vec3(1.0), vec3(1.0))";
  cases[10]._16_8_ = &DAT_100000001;
  cases[10]._24_8_ = &DAT_100000001;
  cases[10].output = 3.0;
  cases[0xb].name = "dot_vec4";
  cases[0xb].expression = "dot(vec4(1.0), vec4(1.0))";
  cases[0xb]._16_8_ = &DAT_100000001;
  cases[0xb]._24_8_ = &DAT_100000001;
  cases[0xb].output = 4.0;
  cases[0xc].name = "normalize_float";
  cases[0xc].expression = "normalize(1.0)";
  cases[0xc]._16_8_ = &DAT_100000001;
  cases[0xc]._24_8_ = &DAT_100000001;
  cases[0xc].output = 1.0;
  cases[0xd].name = "normalize_vec2";
  cases[0xd].expression = "normalize(vec2(1.0)).x";
  cases[0xd]._16_8_ = &DAT_100000001;
  cases[0xd]._24_8_ = &DAT_100000001;
  cases[0xd].output = 0.70710677;
  cases[0xe].name = "normalize_vec3";
  cases[0xe].expression = "normalize(vec3(1.0)).x";
  cases[0xe]._16_8_ = &DAT_100000001;
  cases[0xe]._24_8_ = &DAT_100000001;
  cases[0xe].output = 0.57735026;
  addChildGroup(this,"geometric","Geometric",cases,0x19);
  memcpy(cases,&PTR_anon_var_dwarf_1bd0e9a_02181a30,0x438);
  addChildGroup(this,"matrix","Matrix",cases,0x1b);
  memcpy(cases,&PTR_anon_var_dwarf_3c1e1f_02181e70,0x438);
  addChildGroup(this,"vector_relational","Vector relational",cases,0x1b);
  ppuVar4 = &PTR_anon_var_dwarf_246e74c_021822b0;
  pTVar5 = cases;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    pTVar5->name = *ppuVar4;
    ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
    pTVar5 = (TestParams *)((long)pTVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderConstExpr::createTests
            (&children,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo,cases,3,GLSL_VERSION_300_ES,SHADER_FRAGMENT);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "fragment_processing","Fragment processing");
  tcu::TestNode::addChild((TestNode *)this,node);
  iVar2 = (int)((ulong)((long)children.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)children.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      tcu::TestNode::addChild
                (node,children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar3]);
      lVar3 = lVar3 + 1;
      iVar2 = (int)((ulong)((long)children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)children.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (lVar3 < iVar2);
  }
  if (children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)children.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void ShaderConstExprBuiltinTests::init (void)
{
	using namespace gls::ShaderConstExpr;

	// ${T} => final type, ${MT} => final type but with scalar version usable even when T is a vector

	// Trigonometry
	{
		const TestParams cases[] =
		{
			{"radians",			"radians(${T} (90.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRadians(90.0f)		},
			{"degrees",			"degrees(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatDegrees(2.0f)		},
			{"sin",				"sin(${T} (3.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSin(3.0f)			},
			{"cos",				"cos(${T} (3.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCos(3.2f)			},
			{"tan",				"tan(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatTan(1.5f)			},
			{"asin",			"asin(${T} (0.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAsin(0.0f)			},
			{"acos",			"acos(${T} (1.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAcos(1.0f)			},
			{"atan_separate",	"atan(${T} (-1.0), ${T} (-1.0))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtan2(-1.0f, -1.0f)	},
			{"atan_combined",	"atan(${T} (2.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtanOver(2.0f)		},
			{"sinh",			"sinh(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSinh(1.5f)			},
			{"cosh",			"cosh(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCosh(1.5f)			},
			{"tanh",			"tanh(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatTanh(1.5f)			},
			{"asinh",			"asinh(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAsinh(2.0f)			},
			{"acosh",			"acosh(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAcosh(2.0f)			},
			{"atanh",			"atanh(${T} (0.8))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtanh(0.8f)			},
		};

		addChildGroup("angle_and_trigonometry", "Angles and Trigonometry", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Exponential
	{
		const TestParams cases[] =
		{
			{"pow",				"pow(${T} (1.7), ${T} (3.5))",							glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatPow(1.7f, 3.5f)		},
			{"exp",				"exp(${T} (4.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp(4.2f)			},
			{"log",				"log(${T} (42.12))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog(42.12f)			},
			{"exp2",			"exp2(${T} (6.7))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp2(6.7f)			},
			{"log2",			"log2(${T} (100.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog2(100.0f)			},
			{"sqrt",			"sqrt(${T} (10.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSqrt(10.0f)			},
			{"inversesqrt",		"inversesqrt(${T} (10.0))",								glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRsq(10.0f)			},
		};

		addChildGroup("exponential", "Exponential", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Common
	{
		const TestParams cases[] =
		{
			{"abs",				"abs(${T} (-42.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 42.0f						},
			{"abs",				"abs(${T} (-42))",										glu::TYPE_INT,   1, 4, glu::TYPE_INT,   42.0f						},
			{"sign",			"sign(${T} (-18.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},
			{"sign",			"sign(${T} (-18))",										glu::TYPE_INT,   1, 4, glu::TYPE_INT,	-1.0f						},
			{"floor",			"floor(${T} (37.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFloor(37.3f)			},
			{"trunc",			"trunc(${T} (-1.8))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},
			{"round",			"round(${T} (42.7))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 42.0f						},
			{"roundEven",		"roundEven(${T} (1.5))",								glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT,  2.0f						},
			{"ceil",			"ceil(${T} (82.2))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCeil(82.2f)			},
			{"fract",			"fract(${T} (17.75))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFrac(17.75f)			},
			{"mod",				"mod(${T} (87.65), ${MT} (3.7))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatMod(87.65f, 3.7f)	},
			// modf cannot be tested due to lacking valid ways of using the 'out' parameter in a constant expression
			{"min",				"min(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 12.3f						},
			{"min",				"min(${T} (13), ${MT} (-14))",							glu::TYPE_INT,   1, 4, glu::TYPE_INT,  -14.0f						},
			{"min",				"min(${T} (13), ${MT} (14))",							glu::TYPE_UINT,  1, 4, glu::TYPE_UINT,	13.0f						},
			{"max",				"max(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 32.1f						},
			{"max",				"max(${T} (13), ${MT} (-14))",							glu::TYPE_INT,   1, 4, glu::TYPE_INT,	13.0f						},
			{"max",				"max(${T} (13), ${MT} (14))",							glu::TYPE_UINT,  1, 4, glu::TYPE_UINT,	14.0f						},
			{"clamp",			"clamp(${T} (42.1),	${MT} (10.0), ${MT} (15.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 15.0f						},
			{"clamp",			"clamp(${T} (42), ${MT} (-10), ${MT} (15))",			glu::TYPE_INT,   1, 4, glu::TYPE_INT,	15.0f						},
			{"clamp",			"clamp(${T} (42), ${MT} (10), ${MT} (15))",				glu::TYPE_UINT,  1, 4, glu::TYPE_UINT,	15.0f						},

			{"mix",				"mix(${T} (10.0), ${T} (20.0), ${MT}(0.75))",			glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 17.5f						},
			{"mix_float_bool",	"mix(float(10.0), float(20.0), bool(1))",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},
			{"mix_vec2_bvec2",	"mix(vec2(10.0), vec2(20.0), bvec2(1)).x",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},
			{"mix_vec3_bvec3",	"mix(vec3(10.0), vec3(20.0), bvec3(1)).x",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},
			{"mix_vec4_bvec4",	"mix(vec4(10.0), vec4(20.0), bvec4(1)).x",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},

			{"step",			"step(${MT} (3.2), ${T} (4.2))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 1.0f						},
			{"smoothstep",		"smoothstep(${MT} (3.0), ${MT} (5.0), ${T} (4.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.5f						},
			{"isnan",			"isnan(${T} (1.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_BOOL,  0.0f						},
			{"isinf",			"isinf(${T} (1.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_BOOL,  0.0f						},
			{"floatbits_int",	"intBitsToFloat(floatBitsToInt(42.12))",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 42.12f						},
			{"floatbits_uint",	"uintBitsToFloat(floatBitsToUint(-14.2))",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -14.2f						},
		};

		addChildGroup("common", "Common", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Floating point pack & unpack
	{
		const TestParams cases[] =
		{
			{"packSnorm2x16",	"packSnorm2x16(vec2(0.7, 0.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_UINT,  22937.0f					},
			{"unpackSnorm2x16",	"unpackSnorm2x16(22937u).x",							glu::TYPE_UINT,  1, 1, glu::TYPE_FLOAT, 0.7f						},
			{"packUnorm2x16",	"packUnorm2x16(vec2(0.6, -0.3))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_UINT,	39321.0f					},
			{"unpackUnorm2x16",	"unpackUnorm2x16(39321u).x",							glu::TYPE_UINT,  1, 1, glu::TYPE_FLOAT, 0.6f						},
			{"packHalf2x16",	"unpackHalf2x16(packHalf2x16(vec2(0.3, 0.1))).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.3f						},
			// \todo [2014-01-29 otto] Separate testing of half-precision pack & unpack
		};

		addChildGroup("float_pack_unpack", "Floating point pack & unpack", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Geometric
	{
		const TestParams cases[] =
		{
			{"length_float",	"length(1.0)",											glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"length_vec2",		"length(vec2(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"length_vec3",		"length(vec3(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"length_vec4",		"length(vec4(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"distance_float",	"distance(1.0, 2.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"distance_vec2",	"distance(vec2(1.0), vec2(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"distance_vec3",	"distance(vec3(1.0), vec3(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"distance_vec4",	"distance(vec4(1.0), vec4(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"dot_float",		"dot(1.0, 1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"dot_vec2",		"dot(vec2(1.0), vec2(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"dot_vec3",		"dot(vec3(1.0), vec3(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 3.0f						},
			{"dot_vec4",		"dot(vec4(1.0), vec4(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 4.0f						},

			{"normalize_float",	"normalize(1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"normalize_vec2",	"normalize(vec2(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(2.0f)			},
			{"normalize_vec3",	"normalize(vec3(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(3.0f)			},
			{"normalize_vec4",	"normalize(vec4(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(4.0f)			},

			{"faceforward",		"faceforward(${T} (1.0), ${T} (1.0), ${T} (1.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},

			// reflect(I, N) => I - 2*dot(N, I)*N
			{"reflect_float",	"reflect(1.0, 1.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec2",	"reflect(vec2(1.0), vec2(1.0, 0.0)).x",					glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec3",	"reflect(vec3(1.0), vec3(1.0, 0.0, 0.0)).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec4",	"reflect(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0)).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},

			/*
			genType refract(genType I, genType N, float eta) =>
				k = 1.0 - (eta^2)*(1.0-dot(N,I)^2)
				if k < 0 return 0.0
				else return eta*I - (eta*dot(N,I) + sqrt(k))*N
			*/
			{"refract_float",	"refract(1.0, 1.0, 0.5)",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec2",	"refract(vec2(1.0), vec2(1.0, 0.0), 0.5).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec3",	"refract(vec3(1.0), vec3(1.0, 0.0, 0.0), 0.5).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec4",	"refract(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0), 0.5).x",	glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
		};

		addChildGroup("geometric", "Geometric", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Matrix
	{
		const TestParams cases[] =
		{
			{"compMult_mat2",	"matrixCompMult(mat2(1.0), mat2(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat3",	"matrixCompMult(mat3(1.0), mat3(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat4",	"matrixCompMult(mat4(1.0), mat4(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"outerProd_mat2",	"outerProduct(vec2(3.0), vec2(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat3",	"outerProduct(vec3(3.0), vec3(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat4",	"outerProduct(vec4(3.0), vec4(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},

			{"outerProd_mat2x3","outerProduct(vec3(3.0), vec2(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat3x2","outerProduct(vec2(3.0), vec3(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat2x4","outerProduct(vec4(3.0), vec2(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat4x2","outerProduct(vec2(3.0), vec4(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat3x4","outerProduct(vec4(3.0), vec3(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat4x3","outerProduct(vec3(3.0), vec4(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},

			{"transpose_mat2",	"transpose(mat2(2.0))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"transpose_mat3",	"transpose(mat3(2.0))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"transpose_mat4",	"transpose(mat4(2.0))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"transpose_mat3x2","transpose(mat3x2(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat2x3","transpose(mat2x3(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat4x2","transpose(mat4x2(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat4x3","transpose(mat4x3(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat2x4","transpose(mat2x4(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat3x4","transpose(mat3x4(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},

			{"determinant_mat2","determinant(mat2(2.0))",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 4.0f						},
			{"determinant_mat3","determinant(mat3(2.0))",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 8.0f						},
			{"determinant_mat4","determinant(mat4(2.0))",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 16.0f						},

			{"inverse_mat2",	"inverse(mat2(2.0))[0][0]",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.5f						},
			{"inverse_mat3",	"inverse(mat3(2.0))[0][0]",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.5f						},
			{"inverse_mat4",	"inverse(mat4(2.0))[0][0]",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.5f						},
		};

		addChildGroup("matrix", "Matrix", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Vector relational
	{
		const TestParams cases[] =
		{
			{"lessThan",		"lessThan(${T} (1.0), ${T} (2.0))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThan",		"lessThan(${T} (-1), ${T} (2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThan",		"lessThan(${T} (1), ${T} (2))",							glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1.0), ${T} (1.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (-1), ${T} (-1))",					glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1), ${T} (1))",					glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"greaterThan",		"greaterThan(${T} (1.0), ${T} (2.0))",					glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThan",		"greaterThan(${T} (-1), ${T} (2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThan",		"greaterThan(${T} (1), ${T} (2))",						glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1.0), ${T} (2.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (-1), ${T} (2))",				glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1), ${T} (2))",					glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1), ${T} (-2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1), ${T} (2))",							glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (true), ${T} (false))",						glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"notEqual",		"notEqual(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (1), ${T} (-2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (1), ${T} (2))",							glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (true), ${T} (false))",					glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec2",		"any(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec3",		"any(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec4",		"any(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"all_bvec2",		"all(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec3",		"all(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec4",		"all(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"not",				"not(${T} (false))",									glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						},
		};

		addChildGroup("vector_relational", "Vector relational", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Fragment processing (must return zero when used in initilizer with constexpr arguement)
	{
		const TestParams cases[] =
		{
			{"dFdx",			"dFdx(${T} (123.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.0							},
			{"dFdy",			"dFdx(${T} (234.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.0							},
			{"fwidth",			"fwidth(${T} (345.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.0							},
		};

		const std::vector<tcu::TestNode*>	children = createTests(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), cases, DE_LENGTH_OF_ARRAY(cases), glu::GLSL_VERSION_300_ES, SHADER_FRAGMENT);
		tcu::TestCaseGroup*					group	 = new tcu::TestCaseGroup(m_testCtx, "fragment_processing", "Fragment processing");

		addChild(group);

		for (int i = 0; i < (int)children.size(); i++)
			group->addChild(children[i]);
	}
}